

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall gvr::Model::setOriginToPLY(Model *this,PLYWriter *ply)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  double dVar3;
  ostringstream out2;
  ostringstream out;
  string sStack_328;
  string local_308 [11];
  long local_190;
  undefined8 local_188 [46];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x10;
  std::operator<<((ostream *)&local_190,"Origin ");
  poVar1 = std::ostream::_M_insert<double>((this->origin).v[0]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>((this->origin).v[1]);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>((this->origin).v[2]);
  std::__cxx11::stringbuf::str();
  PLYWriter::addComment(ply,local_308);
  std::__cxx11::string::~string((string *)local_308);
  dVar3 = gmath::det<double>(&this->Rc);
  if (ABS(dVar3 + -1.0) < 1e-06) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
    poVar1 = std::operator<<((ostream *)local_308,"Camera ");
    pbVar2 = gmath::operator<<(poVar1,&this->Rc);
    poVar1 = std::operator<<(pbVar2," ");
    gmath::operator<<(poVar1,&this->Tc);
    std::__cxx11::stringbuf::str();
    PLYWriter::addComment(ply,&sStack_328);
    std::__cxx11::string::~string((string *)&sStack_328);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return;
}

Assistant:

void Model::setOriginToPLY(PLYWriter &ply) const
{
  std::ostringstream out;

  out.precision(16);
  out << "Origin " << origin[0] << " " << origin[1] << " " << origin[2];
  ply.addComment(out.str());

  if (std::abs(det(Rc)-1) < 1e-6)
  {
    std::ostringstream out2;

    out2 << "Camera " << Rc << " " << Tc;
    ply.addComment(out2.str());
  }
}